

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O3

void __thiscall chipemu::implementation::nmos::stabilize_network(nmos *this)

{
  ushort *puVar1;
  pointer puVar2;
  pointer puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  ushort uVar7;
  uint16_t uVar8;
  
  uVar8 = this->desc_nodes_count;
  if (uVar8 == 0) {
    puVar5 = (this->changed_feeding)._M_current;
  }
  else {
    puVar2 = (this->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->node_offsets).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (this->changed_queue).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->changed_queue).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar5 = (this->changed_feeding)._M_current;
    uVar7 = 1;
    do {
      if ((puVar2[puVar3[uVar7]] & 8) == 0) {
        *puVar5 = uVar7;
        puVar5 = puVar5 + 1;
        if (puVar5 == puVar4) {
          puVar5 = puVar6;
        }
        (this->changed_feeding)._M_current = puVar5;
        puVar1 = puVar2 + puVar3[uVar7];
        *puVar1 = *puVar1 | 8;
        uVar8 = this->desc_nodes_count;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 <= uVar8);
  }
  puVar6 = (this->changed_eating)._M_current;
  if (puVar6 != puVar5) {
    do {
      uVar8 = *puVar6;
      (this->changed_eating)._M_current = puVar6 + 1;
      if (puVar6 + 1 ==
          (this->changed_queue).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        (this->changed_eating)._M_current =
             (this->changed_queue).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      recalc_node(this,uVar8);
      puVar6 = (this->changed_eating)._M_current;
    } while (puVar6 != (this->changed_feeding)._M_current);
  }
  return;
}

Assistant:

void
nmos::stabilize_network() noexcept
{
    for (uint16_t i = 1; i <= node_count(); ++i) {
        changed_push(i);
    }
    recalc_nodes();
}